

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QXdgDesktopPortalFileDialog::Filter>::Inserter::insert
          (Inserter *this,qsizetype pos,Filter *t,qsizetype n)

{
  qsizetype in_RCX;
  qsizetype in_RSI;
  Inserter *in_RDI;
  qsizetype i_3;
  qsizetype i_2;
  qsizetype i_1;
  qsizetype i;
  qsizetype oldSize;
  Filter *in_stack_ffffffffffffffa8;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  
  setup(in_RDI,in_RSI,in_RCX);
  for (local_30 = 0; local_30 != in_RDI->sourceCopyConstruct; local_30 = local_30 + 1) {
    QXdgDesktopPortalFileDialog::Filter::Filter((Filter *)in_RDI,in_stack_ffffffffffffffa8);
    in_RDI->size = in_RDI->size + 1;
  }
  for (local_38 = in_RDI->sourceCopyConstruct; local_38 != in_RDI->nSource; local_38 = local_38 + 1)
  {
    QXdgDesktopPortalFileDialog::Filter::Filter((Filter *)in_RDI,in_stack_ffffffffffffffa8);
    in_RDI->size = in_RDI->size + 1;
  }
  for (local_40 = 0; local_40 != in_RDI->move; local_40 = local_40 + -1) {
    QXdgDesktopPortalFileDialog::Filter::operator=((Filter *)in_RDI,in_stack_ffffffffffffffa8);
  }
  for (local_48 = 0; local_48 != in_RDI->sourceCopyAssign; local_48 = local_48 + 1) {
    QXdgDesktopPortalFileDialog::Filter::operator=((Filter *)in_RDI,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void insert(qsizetype pos, const T &t, qsizetype n)
        {
            const qsizetype oldSize = size;
            Q_UNUSED(oldSize);

            setup(pos, n);

            // first create new elements at the end, by copying from elements
            // to be inserted (if they extend past the current end of the array)
            for (qsizetype i = 0; i != sourceCopyConstruct; ++i) {
                new (end + i) T(t);
                ++size;
            }
            Q_ASSERT(size <= oldSize + n);

            // now move construct new elements at the end from existing elements inside
            // the array.
            for (qsizetype i = sourceCopyConstruct; i != nSource; ++i) {
                new (end + i) T(std::move(*(end + i - nSource)));
                ++size;
            }
            // array has the new size now!
            Q_ASSERT(size == oldSize + n);

            // now move assign existing elements towards the end
            for (qsizetype i = 0; i != move; --i)
                last[i] = std::move(last[i - nSource]);

            // finally copy the remaining elements from source over
            for (qsizetype i = 0; i != sourceCopyAssign; ++i)
                where[i] = t;
        }